

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5PoslistNext64(u8 *a,int n,int *pi,i64 *piOff)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  u32 *puVar4;
  long *in_RCX;
  int iVar5;
  int iVar6;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  i64 iOff;
  int i;
  u32 iVal;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = *in_RDX;
  if (in_ESI <= iVar6) {
    *in_RCX = -1;
    local_10 = 1;
    goto LAB_00272c0f;
  }
  puVar4 = (u32 *)*in_RCX;
  iVar5 = iVar6 + 1;
  uVar3 = (uint)*(byte *)(in_RDI + iVar6);
  if ((*(byte *)(in_RDI + iVar6) & 0x80) != 0) {
    iVar5 = sqlite3Fts5GetVarint32((uchar *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),puVar4);
    iVar5 = iVar5 + iVar6;
  }
  if (uVar3 < 2) {
    if (uVar3 == 0) {
      *in_RDX = iVar5;
      local_10 = 0;
      goto LAB_00272c0f;
    }
    iVar6 = iVar5 + 1;
    bVar1 = *(byte *)(in_RDI + iVar5);
    if ((bVar1 & 0x80) != 0) {
      iVar6 = sqlite3Fts5GetVarint32((uchar *)CONCAT44(iVar5,in_stack_ffffffffffffffc8),puVar4);
      iVar6 = iVar6 + iVar5;
    }
    puVar4 = (u32 *)((ulong)bVar1 << 0x20);
    iVar5 = iVar6 + 1;
    bVar1 = *(byte *)(in_RDI + iVar6);
    if ((bVar1 & 0x80) != 0) {
      iVar5 = sqlite3Fts5GetVarint32((uchar *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),puVar4);
      iVar5 = iVar5 + iVar6;
    }
    if (bVar1 < 2) {
      *in_RCX = -1;
      local_10 = 1;
      goto LAB_00272c0f;
    }
    *in_RCX = (long)puVar4 + (ulong)(bVar1 - 2 & 0x7fffffff);
  }
  else {
    *in_RCX = ((ulong)puVar4 & 0x7fffffff00000000) +
              ((long)puVar4 + (ulong)(uVar3 - 2) & 0x7fffffff);
  }
  *in_RDX = iVar5;
  local_10 = 0;
LAB_00272c0f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5PoslistNext64(
  const u8 *a, int n,             /* Buffer containing poslist */
  int *pi,                        /* IN/OUT: Offset within a[] */
  i64 *piOff                      /* IN/OUT: Current offset */
){
  int i = *pi;
  assert( a!=0 || i==0 );
  if( i>=n ){
    /* EOF */
    *piOff = -1;
    return 1;
  }else{
    i64 iOff = *piOff;
    u32 iVal;
    assert( a!=0 );
    fts5FastGetVarint32(a, i, iVal);
    if( iVal<=1 ){
      if( iVal==0 ){
        *pi = i;
        return 0;
      }
      fts5FastGetVarint32(a, i, iVal);
      iOff = ((i64)iVal) << 32;
      assert( iOff>=0 );
      fts5FastGetVarint32(a, i, iVal);
      if( iVal<2 ){
        /* This is a corrupt record. So stop parsing it here. */
        *piOff = -1;
        return 1;
      }
      *piOff = iOff + ((iVal-2) & 0x7FFFFFFF);
    }else{
      *piOff = (iOff & (i64)0x7FFFFFFF<<32)+((iOff + (iVal-2)) & 0x7FFFFFFF);
    }
    *pi = i;
    assert_nc( *piOff>=iOff );
    return 0;
  }
}